

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_warning(png_const_structrp png_ptr,png_const_charp warning_message)

{
  int local_1c;
  int offset;
  png_const_charp warning_message_local;
  png_const_structrp png_ptr_local;
  
  local_1c = 0;
  if ((png_ptr != (png_const_structrp)0x0) && (*warning_message == '#')) {
    for (local_1c = 1; (local_1c < 0xf && (warning_message[local_1c] != ' '));
        local_1c = local_1c + 1) {
    }
  }
  if ((png_ptr == (png_const_structrp)0x0) || (png_ptr->warning_fn == (png_error_ptr)0x0)) {
    png_default_warning(png_ptr,warning_message + local_1c);
  }
  else {
    (*png_ptr->warning_fn)(png_ptr,warning_message + local_1c);
  }
  return;
}

Assistant:

void PNGAPI
png_warning(png_const_structrp png_ptr, png_const_charp warning_message)
{
   int offset = 0;
   if (png_ptr != NULL)
   {
#ifdef PNG_ERROR_NUMBERS_SUPPORTED
   if ((png_ptr->flags &
       (PNG_FLAG_STRIP_ERROR_NUMBERS|PNG_FLAG_STRIP_ERROR_TEXT)) != 0)
#endif
      {
         if (*warning_message == PNG_LITERAL_SHARP)
         {
            for (offset = 1; offset < 15; offset++)
               if (warning_message[offset] == ' ')
                  break;
         }
      }
   }
   if (png_ptr != NULL && png_ptr->warning_fn != NULL)
      (*(png_ptr->warning_fn))(png_constcast(png_structrp,png_ptr),
          warning_message + offset);
   else
      png_default_warning(png_ptr, warning_message + offset);
}